

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<64U,_2U,_buffer_layout_dfs>::operator()
          (fill<64U,_2U,_buffer_layout_dfs> *this,array<Stream,_64UL> *streams,uchar **buffer,
          array<unsigned_long,_64UL> *buffer_count)

{
  uchar **from0;
  size_t from0_00;
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  value_type vVar4;
  array<unsigned_long,_64UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_64UL> *streams_local;
  fill<64U,_2U,_buffer_layout_dfs> *this_local;
  uchar **resultbuf_2;
  uchar **l_1;
  size_t lcount_1;
  uchar **newbegin_1;
  uchar **begin_1;
  uchar **local_b8;
  uchar **resultbuf_1;
  uchar **r_1;
  size_t rcount_1;
  uchar **newbegin;
  uchar **begin;
  uchar **local_88;
  uchar **resultbuf;
  uchar **r;
  uchar **l;
  size_t rcount;
  size_t lcount;
  fill<64U,_4U,_buffer_layout_dfs> local_49;
  long local_48;
  size_t need;
  DI __d;
  
  __d.i = (string *)buffer_count;
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"fill_inner");
  poVar2 = std::operator<<(poVar2,", inner, I=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
  std::operator<<(poVar2,"\n");
  fill_inner<64u,2u,buffer_layout_dfs>(std::array<Stream,64u>&,unsigned_char**,std::
  array<unsigned_long,64u>&,std::integral_constant<bool,true>)::DI::DI(std::__cxx11::string__
            (&need,(string *)__debug_indent_str_abi_cxx11_);
  local_48 = 8;
  do {
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
    if (*pvVar3 == 0) {
      fill<64U,_4U,_buffer_layout_dfs>::operator()
                (&local_49,streams,buffer,(array<unsigned_long,_64UL> *)__d.i);
      pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
      if (*pvVar3 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar2,"left stream drained\n");
        goto LAB_0021f201;
      }
    }
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
    if (*pvVar3 == 0) {
      fill<64U,_5U,_buffer_layout_dfs>::operator()
                ((fill<64U,_5U,_buffer_layout_dfs> *)((long)&lcount + 3),streams,buffer,
                 (array<unsigned_long,_64UL> *)__d.i);
      pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
      if (*pvVar3 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar2,"right stream drained\n");
        goto LAB_0021f475;
      }
    }
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
    rcount = *pvVar3;
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
    l = (uchar **)*pvVar3;
    r = buffer + (0x1f - rcount);
    resultbuf = buffer + (0x50e - (long)l);
    local_88 = buffer + (8 - local_48);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"L:\'");
    poVar2 = std::operator<<(poVar2,*r);
    poVar2 = std::operator<<(poVar2,"\', R:\'");
    poVar2 = std::operator<<(poVar2,*resultbuf);
    std::operator<<(poVar2,"\'\n");
    iVar1 = cmp(*r,*resultbuf);
    if (iVar1 < 1) {
      *local_88 = *r;
      pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
      *pvVar3 = *pvVar3 - 1;
    }
    else {
      *local_88 = *resultbuf;
      pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
      *pvVar3 = *pvVar3 - 1;
    }
    check_input(buffer,8 - local_48);
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar2,"Done, buffer filled\n");
  pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
  *pvVar3 = 8;
  goto LAB_0021f6cd;
LAB_0021f201:
  do {
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
    if (*pvVar3 == 0) {
      fill<64U,_5U,_buffer_layout_dfs>::operator()
                ((fill<64U,_5U,_buffer_layout_dfs> *)((long)&begin + 3),streams,buffer,
                 (array<unsigned_long,_64UL> *)__d.i);
      pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
      if (*pvVar3 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar2,"both streams prematurely drained\n");
        rcount_1 = (size_t)(buffer + local_48);
        newbegin = buffer;
        memmove((void *)rcount_1,buffer,(8 - local_48) * 8);
        vVar4 = 8 - local_48;
        pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
        from0_00 = rcount_1;
        *pvVar3 = vVar4;
        pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
        check_input((uchar **)from0_00,*pvVar3);
        goto LAB_0021f6cd;
      }
    }
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
    r_1 = (uchar **)*pvVar3;
    resultbuf_1 = buffer + (0x50e - (long)r_1);
    local_b8 = buffer + (8 - local_48);
    *local_b8 = *resultbuf_1;
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,5);
    *pvVar3 = *pvVar3 - 1;
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar2,"\tbuffer filled\n");
  pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
  *pvVar3 = 8;
  pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
  check_input(buffer,*pvVar3);
  goto LAB_0021f6cd;
LAB_0021f475:
  do {
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
    if (*pvVar3 == 0) {
      fill<64U,_4U,_buffer_layout_dfs>::operator()
                ((fill<64U,_4U,_buffer_layout_dfs> *)((long)&begin_1 + 7),streams,buffer,
                 (array<unsigned_long,_64UL> *)__d.i);
      pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
      if (*pvVar3 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar2,"both streams prematurely drained\n");
        from0 = buffer + local_48;
        memmove(from0,buffer,(8 - local_48) * 8);
        vVar4 = 8 - local_48;
        pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
        *pvVar3 = vVar4;
        pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
        check_input(from0,*pvVar3);
        goto LAB_0021f6cd;
      }
    }
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
    buffer[8 - local_48] = buffer[0x1f - *pvVar3];
    pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,4);
    *pvVar3 = *pvVar3 - 1;
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar2,"buffer filled\n");
  pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
  *pvVar3 = 8;
  pvVar3 = std::array<unsigned_long,_64UL>::operator[]((array<unsigned_long,_64UL> *)__d.i,2);
  check_input(buffer,*pvVar3);
LAB_0021f6cd:
  begin._4_4_ = 1;
  anon_func::DI::~DI((DI *)&need);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}